

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O2

int blake2s_init_param(blake2s_state *S,blake2s_param *P)

{
  long lVar1;
  
  memset(S,0,0x88);
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)S->h + lVar1) = *(undefined4 *)((long)blake2s_IV + lVar1);
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    S->h[lVar1] = S->h[lVar1] ^ *(uint *)(P->salt + lVar1 * 4 + -0x10);
  }
  S->outlen = (ulong)P->digest_length;
  return 0;
}

Assistant:

int blake2s_init_param( blake2s_state *S, const blake2s_param *P )
{
  const unsigned char *p = ( const unsigned char * )( P );
  size_t i;

  blake2s_init0( S );

  /* IV XOR ParamBlock */
  for( i = 0; i < 8; ++i )
    S->h[i] ^= load32( &p[i * 4] );

  S->outlen = P->digest_length;
  return 0;
}